

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<double,double>(Thread *this,BinopFunc<double,_double> *f)

{
  double dVar1;
  Simd<double,_(unsigned_char)__x02_> SVar2;
  byte local_49;
  double dStack_48;
  u8 i;
  SR result;
  Simd<double,_(unsigned_char)__x02_> lhs;
  Simd<double,_(unsigned_char)__x02_> rhs;
  BinopFunc<double,_double> *f_local;
  Thread *this_local;
  
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  SVar2 = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  result.v[1] = SVar2.v[0];
  lhs.v[0] = SVar2.v[1];
  for (local_49 = 0; local_49 < 2; local_49 = local_49 + 1) {
    dVar1 = (*f)(result.v[(ulong)local_49 + 1],lhs.v[(ulong)local_49 + 1]);
    lhs.v[(ulong)local_49 - 3] = dVar1;
  }
  SVar2.v[1] = result.v[0];
  SVar2.v[0] = dStack_48;
  Push<wabt::interp::Simd<double,(unsigned_char)2>>(this,SVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}